

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerGLSL::emit_resources(CompilerGLSL *this)

{
  Types TVar1;
  size_t sVar2;
  uint *puVar3;
  Variant *pVVar4;
  size_t sVar5;
  bool bVar6;
  bool bVar7;
  uint32_t uVar8;
  uint uVar9;
  ExecutionModel EVar10;
  SPIREntryPoint *pSVar11;
  SPIRConstant *constant;
  SPIRConstantOp *constant_00;
  SPIRType *pSVar12;
  SPIRVariable *pSVar13;
  mapped_type *pmVar14;
  undefined1 *puVar15;
  ulong uVar16;
  runtime_error *this_00;
  Variant *ts_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1_00;
  StorageClass SVar17;
  uint uVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  uint32_t *puVar19;
  ID *__k;
  byte bVar20;
  uint32_t *puVar21;
  long lVar22;
  TypedID<(spirv_cross::Types)0> *pTVar23;
  bool emitted;
  bool emitted_base_instance;
  SpecializationConstant wg_x;
  SpecializationConstant wg_z;
  LoopLock loop_lock;
  char *storage;
  char local_1299;
  SPIREntryPoint *local_1298;
  ParsedIR *local_1290;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_1288;
  SpecializationConstant local_1280;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1278;
  SpecializationConstant local_1270;
  _Alloc_hider local_1268;
  undefined1 local_1258 [16];
  SpecializationConstant local_1248;
  undefined1 local_1240 [24];
  uint32_t local_1228 [64];
  undefined1 local_1128 [4120];
  Buffer *local_110;
  size_t local_108;
  size_t local_100;
  Buffer local_f8 [8];
  
  pSVar11 = Compiler::get_entry_point(&this->super_Compiler);
  (*(this->super_Compiler)._vptr_Compiler[0x39])(this);
  if (pSVar11->model == ExecutionModelFragment) {
    uVar9 = 0x81;
    if ((this->options).es != false) {
      uVar9 = 299;
    }
    if ((this->options).version <= uVar9) {
      replace_fragment_outputs(this);
    }
  }
  if (((this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    emit_pls(this);
  }
  EVar10 = pSVar11->model;
  if ((EVar10 - ExecutionModelTessellationControl < 3) || (EVar10 == ExecutionModelMeshEXT)) {
    fixup_implicit_builtin_block_names(this,EVar10);
  }
  if (((this->options).separate_shader_objects == true) && ((this->options).es == false)) {
    EVar10 = pSVar11->model;
    if ((int)EVar10 < 4) {
      if (EVar10 - ExecutionModelTessellationControl < 3) {
        emit_declared_builtin_block(this,StorageClassInput,EVar10);
        goto LAB_001cfd74;
      }
      if (EVar10 != ExecutionModelVertex) goto LAB_001cfd88;
    }
    else {
      if (EVar10 == ExecutionModelFragment) goto LAB_001cfd1b;
      if (EVar10 != ExecutionModelMeshEXT) goto LAB_001cfd88;
    }
    SVar17 = StorageClassOutput;
  }
  else {
LAB_001cfd1b:
    bVar6 = should_force_emit_builtin_block(this,StorageClassOutput);
    if (bVar6) {
LAB_001cfd74:
      EVar10 = pSVar11->model;
      SVar17 = StorageClassOutput;
    }
    else {
      if (pSVar11->geometry_passthrough != true) {
        local_1128._0_8_ = "--pls-out";
        if (pSVar11->model == ExecutionModelFragment) {
          local_1128._0_8_ = "--pls-in";
        }
        local_1128._0_8_ = local_1128._0_8_ + 6;
        puVar19 = &(this->super_Compiler).clip_distance_count;
        if ((this->super_Compiler).clip_distance_count != 0) {
          statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                    (this,(char **)local_1128,(char (*) [24])0x340350,puVar19,(char (*) [3])0x347e56
                    );
        }
        if ((this->super_Compiler).cull_distance_count == 0) {
          bVar6 = true;
        }
        else {
          statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                    (this,(char **)local_1128,(char (*) [24])0x340369,
                     &(this->super_Compiler).cull_distance_count,(char (*) [3])0x347e56);
          bVar6 = (this->super_Compiler).cull_distance_count == 0;
        }
        if ((*puVar19 != 0) || (!bVar6)) {
          statement<char_const(&)[1]>(this,(char (*) [1])0x33bad0);
        }
        goto LAB_001cfd88;
      }
      EVar10 = pSVar11->model;
      SVar17 = StorageClassInput;
    }
  }
  emit_declared_builtin_block(this,SVar17,EVar10);
LAB_001cfd88:
  local_1298 = pSVar11;
  if ((this->super_Compiler).position_invariant == true) {
    statement<char_const(&)[23]>(this,(char (*) [23])"invariant gl_Position;");
    statement<char_const(&)[1]>(this,(char (*) [1])0x33bad0);
  }
  local_1299 = '\0';
  local_1290 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(local_1290);
  sVar2 = (this->super_Compiler).ir.ids_for_constant_or_type.
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar23 = (this->super_Compiler).ir.ids_for_constant_or_type.
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar22 = 0;
    do {
      ts_1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      pVVar4 = ts_1 + *(uint *)((long)&pTVar23->id + lVar22);
      TVar1 = pVVar4->type;
      if (TVar1 == TypeType) {
        pSVar12 = Variant::get<spirv_cross::SPIRType>(pVVar4);
        if (*(int *)&(pSVar12->super_IVariant).field_0xc == 0xf) {
          if ((((pSVar12->array).super_VectorView<unsigned_int>.buffer_size != 0) ||
              (pSVar12->pointer != false)) ||
             (bVar6 = Compiler::has_decoration
                                (&this->super_Compiler,(ID)(pSVar12->super_IVariant).self.id,
                                 DecorationBlock), bVar6)) {
            bVar6 = false;
          }
          else {
            bVar6 = Compiler::has_decoration
                              (&this->super_Compiler,(ID)(pSVar12->super_IVariant).self.id,
                               DecorationBufferBlock);
            bVar6 = !bVar6;
          }
          if (((*(int *)&(pSVar12->super_IVariant).field_0xc == 0xf) && (pSVar12->pointer == true))
             && ((bVar7 = Compiler::has_decoration
                                    (&this->super_Compiler,(ID)(pSVar12->super_IVariant).self.id,
                                     DecorationBlock), bVar7 &&
                 ((uVar9 = pSVar12->storage - StorageClassRayPayloadKHR, uVar9 < 5 &&
                  ((0x13U >> (uVar9 & 0x1f) & 1) != 0)))))) {
            pSVar12 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_Compiler).ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 (pSVar12->parent_type).id);
          }
          else if (!bVar6) goto LAB_001cff8d;
          if (local_1299 == '\x01') {
            statement<char_const(&)[1]>(this,(char (*) [1])0x33bad0);
          }
          local_1299 = '\0';
          emit_struct(this,pSVar12);
        }
      }
      else if (TVar1 == TypeConstantOp) {
        constant_00 = Variant::get<spirv_cross::SPIRConstantOp>(pVVar4);
        emit_specialization_constant_op(this,constant_00);
LAB_001cfebf:
        local_1299 = '\x01';
      }
      else if (TVar1 == TypeConstant) {
        constant = Variant::get<spirv_cross::SPIRConstant>(pVVar4);
        if ((constant->specialization != false) || ((constant->is_used_as_lut & 1U) != 0)) {
          if ((constant->specialization != false) && ((this->options).vulkan_semantics == false)) {
            uVar8 = Compiler::get_decoration
                              (&this->super_Compiler,(ID)(constant->super_IVariant).self.id,
                               DecorationSpecId);
            local_1268._M_p._0_4_ = uVar8;
            join<char_const(&)[25],unsigned_int&>
                      ((string *)local_1128,(spirv_cross *)"SPIRV_CROSS_CONSTANT_ID_",
                       (char (*) [25])&local_1268,(uint *)ts_1);
            ::std::__cxx11::string::operator=
                      ((string *)&constant->specialization_constant_macro_name,(string *)local_1128)
            ;
            if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
              operator_delete((void *)local_1128._0_8_);
            }
          }
          emit_constant(this,constant);
          goto LAB_001cfebf;
        }
      }
LAB_001cff8d:
      lVar22 = lVar22 + 4;
    } while (sVar2 << 2 != lVar22);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1240);
  if (local_1299 != '\0') {
    statement<char_const(&)[1]>(this,(char (*) [1])0x33bad0);
  }
  if (((local_1298->model == ExecutionModelGLCompute) && ((this->options).vulkan_semantics == false)
      ) && (((local_1298->workgroup_size).constant != 0 ||
            (((local_1298->flags).lower & 0x4000000000) != 0)))) {
    local_1270 = (SpecializationConstant)((ulong)local_1270 & 0xffffffff00000000);
    local_1280.id.id = 0;
    local_1248.id.id = 0;
    Compiler::get_work_group_size_specialization_constants
              (&this->super_Compiler,&local_1270,&local_1280,&local_1248);
    if (((local_1270.id.id != 0) || (local_1280.id.id != 0)) || (local_1248.id.id != 0)) {
      local_1240._0_8_ = local_1228;
      local_1240._8_8_ = 0;
      local_1240._16_8_ = 8;
      build_workgroup_size
                (this,(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)local_1240,&local_1270,&local_1280,&local_1248);
      local_110 = local_f8;
      local_1128._16_8_ = 0;
      local_1128._0_8_ = (char *)0x0;
      local_1128._8_8_ = 0;
      local_108 = 0;
      local_100 = 8;
      StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)local_1128);
      if (local_1240._8_8_ != 0) {
        puVar21 = (uint32_t *)(local_1240._0_8_ + local_1240._8_8_ * 0x20);
        puVar19 = (uint32_t *)local_1240._0_8_;
        do {
          StringStream<4096UL,_4096UL>::append
                    ((StringStream<4096UL,_4096UL> *)local_1128,*(char **)puVar19,
                     *(size_t *)(puVar19 + 2));
          if (puVar19 != (uint32_t *)(local_1240._0_8_ + local_1240._8_8_ * 0x20 + -0x20)) {
            StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)local_1128,", ",2);
          }
          puVar19 = puVar19 + 8;
        } while (puVar19 != puVar21);
      }
      StringStream<4096ul,4096ul>::str_abi_cxx11_((string *)&local_1268,local_1128);
      StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
      statement<char_const(&)[8],std::__cxx11::string,char_const(&)[6]>
                (this,(char (*) [8])"layout(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1268,
                 (char (*) [6])0x33e7f6);
      if ((string *)local_1268._M_p != (string *)local_1258) {
        operator_delete(local_1268._M_p);
      }
      statement<char_const(&)[1]>(this,(char (*) [1])0x33bad0);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_1240);
    }
  }
  local_1299 = '\0';
  if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
    sVar2 = (this->super_Compiler).physical_storage_non_block_pointer_types.
            super_VectorView<unsigned_int>.buffer_size;
    if (sVar2 != 0) {
      puVar3 = (this->super_Compiler).physical_storage_non_block_pointer_types.
               super_VectorView<unsigned_int>.ptr;
      lVar22 = 0;
      do {
        emit_buffer_reference_block(this,*(uint32_t *)((long)puVar3 + lVar22),false);
        lVar22 = lVar22 + 4;
      } while (sVar2 << 2 != lVar22);
    }
    ParsedIR::create_loop_hard_lock(local_1290);
    sVar2 = (this->super_Compiler).ir.ids_for_type[1].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar2 != 0) {
      pTVar23 = (this->super_Compiler).ir.ids_for_type[1].
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar22 = 0;
      do {
        uVar9 = *(uint *)((long)&pTVar23->id + lVar22);
        pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
        if (((pVVar4[uVar9].type == TypeType) &&
            (pSVar12 = Variant::get<spirv_cross::SPIRType>(pVVar4 + uVar9),
            *(int *)&(pSVar12->super_IVariant).field_0xc == 0xf)) &&
           ((pSVar12->pointer == true &&
            ((pSVar12->pointer_depth == 1 &&
             (bVar6 = Compiler::type_is_array_of_pointers(&this->super_Compiler,pSVar12),
             !bVar6 && pSVar12->storage == StorageClassPhysicalStorageBuffer)))))) {
          emit_buffer_reference_block(this,uVar9,true);
        }
        lVar22 = lVar22 + 4;
      } while (sVar2 << 2 != lVar22);
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
    ParsedIR::create_loop_hard_lock(local_1290);
    sVar2 = (this->super_Compiler).ir.ids_for_type[1].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar2 != 0) {
      pTVar23 = (this->super_Compiler).ir.ids_for_type[1].
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar22 = 0;
      do {
        uVar9 = *(uint *)((long)&pTVar23->id + lVar22);
        pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
        if ((((pVVar4[uVar9].type == TypeType) &&
             (pSVar12 = Variant::get<spirv_cross::SPIRType>(pVVar4 + uVar9),
             *(int *)&(pSVar12->super_IVariant).field_0xc == 0xf)) && (pSVar12->pointer == true)) &&
           ((pSVar12->pointer_depth == 1 &&
            (bVar6 = Compiler::type_is_array_of_pointers(&this->super_Compiler,pSVar12),
            !bVar6 && pSVar12->storage == StorageClassPhysicalStorageBuffer)))) {
          emit_buffer_reference_block(this,uVar9,false);
        }
        lVar22 = lVar22 + 4;
      } while (sVar2 << 2 != lVar22);
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  }
  ParsedIR::create_loop_hard_lock(local_1290);
  local_1298 = (SPIREntryPoint *)
               (this->super_Compiler).ir.ids_for_type[2].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (local_1298 != (SPIREntryPoint *)0x0) {
    local_1278 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(this->super_Compiler).ir.ids_for_type[2].
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_1288 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
    local_1298 = (SPIREntryPoint *)((long)local_1298 << 2);
    pTVar23 = (TypedID<(spirv_cross::Types)0> *)0x0;
    do {
      uVar9 = *(uint *)((long)&(local_1278->_M_h)._M_buckets + (long)pTVar23);
      pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar9].type == TypeVariable) {
        pSVar13 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar9);
        pSVar12 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar13->super_IVariant).field_0xc);
        SVar17 = pSVar12->storage;
        bVar20 = 1;
        if (((SVar17 != StorageClassUniform) && (SVar17 != StorageClassStorageBuffer)) &&
           (SVar17 != StorageClassShaderRecordBufferKHR)) {
          bVar20 = 0;
        }
        __k = &(pSVar12->super_IVariant).self;
        pmVar14 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](local_1288,__k);
        if (((pmVar14->decoration).decoration_flags.lower & 4) == 0) {
          pmVar14 = ::std::__detail::
                    _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[](local_1288,__k);
          bVar6 = ((pmVar14->decoration).decoration_flags.lower & 8) == 0;
        }
        else {
          bVar6 = false;
        }
        if (((pSVar13->storage != StorageClassFunction) && ((bVar20 & pSVar12->pointer) != 0)) &&
           (bVar7 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar13,false),
           !bVar6 && !bVar7)) {
          (*(this->super_Compiler)._vptr_Compiler[0x20])(this,pSVar13);
        }
      }
      pTVar23 = pTVar23 + 1;
    } while (local_1298 != (SPIREntryPoint *)pTVar23);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  ParsedIR::create_loop_hard_lock(local_1290);
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar23 = (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar22 = 0;
    do {
      uVar9 = *(uint *)((long)&pTVar23->id + lVar22);
      pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar9].type == TypeVariable) {
        pSVar13 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar9);
        pSVar12 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar13->super_IVariant).field_0xc);
        if (((pSVar13->storage != StorageClassFunction) && (pSVar12->pointer == true)) &&
           ((pSVar12->storage == StorageClassPushConstant &&
            (bVar6 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar13,false), !bVar6)))) {
          (*(this->super_Compiler)._vptr_Compiler[0x21])(this,pSVar13);
        }
      }
      lVar22 = lVar22 + 4;
    } while (sVar2 << 2 != lVar22);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  sVar2 = (this->super_Compiler).combined_image_samplers.
          super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size;
  bVar6 = (this->options).vulkan_semantics;
  ParsedIR::create_loop_hard_lock(local_1290);
  sVar5 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar5 != 0) {
    pTVar23 = (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar22 = 0;
    do {
      uVar9 = *(uint *)((long)&pTVar23->id + lVar22);
      pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar9].type == TypeVariable) {
        pSVar13 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar9);
        pSVar12 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar13->super_IVariant).field_0xc);
        if ((((sVar2 == 0 & bVar6) != 0) ||
            (uVar9 = *(uint *)&(pSVar12->super_IVariant).field_0xc, uVar18 = uVar9 ^ 0x10,
            (pSVar12->image).dim == DimBuffer && uVar18 == 0 ||
            uVar9 != 0x12 && ((pSVar12->image).sampled != 1 || uVar18 != 0))) &&
           ((pSVar13->storage != StorageClassFunction && (pSVar12->pointer == true)))) {
          SVar17 = pSVar12->storage;
          if (((((SVar17 - StorageClassCallableDataKHR < 0xf) &&
                ((0x4c03U >> (SVar17 - StorageClassCallableDataKHR & 0x1f) & 1) != 0)) ||
               (SVar17 == StorageClassAtomicCounter)) || (SVar17 == StorageClassUniformConstant)) &&
             (bVar7 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar13,false), !bVar7)) {
            (*(this->super_Compiler)._vptr_Compiler[0x22])(this,pSVar13);
            local_1299 = '\x01';
          }
        }
      }
      lVar22 = lVar22 + 4;
    } while (sVar5 << 2 != lVar22);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1128);
  if (local_1299 == '\x01') {
    statement<char_const(&)[1]>(this,(char (*) [1])0x33bad0);
  }
  local_1268._M_p = &local_1299;
  local_1299 = '\0';
  local_1270 = (SpecializationConstant)&local_1280;
  local_1280.id.id = local_1280.id.id & 0xffffff00;
  ParsedIR::create_loop_hard_lock(local_1290);
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    local_1298 = (SPIREntryPoint *)
                 (this->super_Compiler).ir.ids_for_type[2].
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar22 = 0;
    do {
      uVar9 = *(uint *)((long)&((_Hashtable *)&local_1298->self)->_M_buckets + lVar22);
      pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar4[uVar9].type == TypeVariable) {
        pSVar13 = Variant::get<spirv_cross::SPIRVariable>(pVVar4 + uVar9);
        pSVar12 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                             ptr + *(uint *)&(pSVar13->super_IVariant).field_0xc);
        bVar6 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar13,false);
        SVar17 = pSVar13->storage;
        if (SVar17 == StorageClassOutput) {
          uVar9 = 0x81;
          if ((this->options).es != false) {
            uVar9 = 299;
          }
          SVar17 = StorageClassOutput;
          if (uVar9 < (this->options).version) {
            uVar8 = Compiler::get_decoration
                              (&this->super_Compiler,(ID)(pSVar13->super_IVariant).self.id,
                               DecorationLocation);
            bVar7 = location_is_framebuffer_fetch(this,uVar8);
            bVar6 = bVar6 && !bVar7;
            SVar17 = pSVar13->storage;
            goto LAB_001d070e;
          }
LAB_001d0713:
          if (((pSVar12->pointer != true) || ((SVar17 | StorageClassUniform) != StorageClassOutput))
             || (bVar7 = Compiler::interface_variable_exists_in_entry_point
                                   (&this->super_Compiler,(pSVar13->super_IVariant).self.id),
                bVar6 != false || !bVar7)) goto LAB_001d0738;
          if (((((this->options).es == true) &&
               (EVar10 = Compiler::get_execution_model(&this->super_Compiler),
               EVar10 == ExecutionModelVertex)) && (pSVar13->storage == StorageClassInput)) &&
             ((pSVar12->array).super_VectorView<unsigned_int>.buffer_size == 1)) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1128._0_8_ = local_1128 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1128,
                       "OpenGL ES doesn\'t support array input variables in vertex shader.","");
            ::std::runtime_error::runtime_error(this_00,(string *)local_1128);
            *(undefined ***)this_00 = &PTR__runtime_error_003d4e98;
            __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          emit_interface_block(this,pSVar13);
          puVar15 = (undefined1 *)&local_1268;
LAB_001d089f:
          **(undefined1 **)puVar15 = 1;
        }
        else {
LAB_001d070e:
          if (SVar17 != StorageClassFunction) goto LAB_001d0713;
LAB_001d0738:
          bVar6 = Compiler::is_builtin_variable(&this->super_Compiler,pSVar13);
          if ((bVar6) &&
             (uVar8 = Compiler::get_decoration
                                (&this->super_Compiler,(ID)(pSVar13->super_IVariant).self.id,
                                 DecorationBuiltIn), (this->options).vulkan_semantics == false)) {
            if (((char)local_1280.id.id == '\0') &&
               ((uVar8 == 0x1149 ||
                ((uVar8 == 0x2b & (this->options).vertex.support_nonzero_base_instance) != 0)))) {
              statement<char_const(&)[37]>
                        (this,(char (*) [37])"#ifdef GL_ARB_shader_draw_parameters");
              statement<char_const(&)[52]>
                        (this,(char (*) [52])"#define SPIRV_Cross_BaseInstance gl_BaseInstanceARB");
              statement<char_const(&)[6]>(this,(char (*) [6])"#else");
              statement<char_const(&)[38]>
                        (this,(char (*) [38])"uniform int SPIRV_Cross_BaseInstance;");
              statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
              local_1299 = '\x01';
              puVar15 = (undefined1 *)&local_1270;
              goto LAB_001d089f;
            }
            if (uVar8 == 0x114a) {
              statement<char_const(&)[38]>
                        (this,(char (*) [38])"#ifndef GL_ARB_shader_draw_parameters");
              statement<char_const(&)[55]>
                        (this,(char (*) [55])
                              "#error GL_ARB_shader_draw_parameters is not supported.");
            }
            else {
              if (uVar8 != 0x1148) goto LAB_001d08a5;
              statement<char_const(&)[37]>
                        (this,(char (*) [37])"#ifdef GL_ARB_shader_draw_parameters");
              statement<char_const(&)[48]>
                        (this,(char (*) [48])"#define SPIRV_Cross_BaseVertex gl_BaseVertexARB");
              statement<char_const(&)[6]>(this,(char (*) [6])"#else");
              statement<char_const(&)[36]>
                        (this,(char (*) [36])"uniform int SPIRV_Cross_BaseVertex;");
            }
            statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
          }
        }
      }
LAB_001d08a5:
      lVar22 = lVar22 + 4;
    } while (sVar2 << 2 != lVar22);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)local_1240);
  sVar2 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.buffer_size;
  if (sVar2 != 0) {
    puVar3 = (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.ptr;
    local_1298 = (SPIREntryPoint *)&this->resource_names;
    local_1278 = &this->block_names;
    local_1288 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_Compiler).ir.meta;
    lVar22 = 0;
    do {
      pSVar13 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + *(uint *)((long)puVar3 + lVar22));
      bVar6 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar13,true);
      if (!bVar6) {
        if (pSVar13->storage == StorageClassOutput) {
          uVar16 = (ulong)(pSVar13->initializer).id;
          if (((uVar16 != 0) &&
              (uVar16 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                        buffer_size)) &&
             (pVVar4 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
             pVVar4[uVar16].type == TypeConstant)) {
            Variant::get<spirv_cross::SPIRConstant>(pVVar4 + uVar16);
            emit_output_variable_initializer(this,pSVar13);
          }
        }
        else {
          bVar6 = variable_is_lut(this,pSVar13);
          if (!bVar6) {
            local_1128._0_4_ = (pSVar13->super_IVariant).self.id;
            pmVar14 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_1288,(key_type *)local_1128);
            add_variable(this,(unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_1298,local_1278,(string *)pmVar14);
            local_1128._0_8_ = local_1128 + 0x10;
            local_1128._8_8_ = 0;
            local_1128._16_8_ = local_1128._16_8_ & 0xffffffffffffff00;
            if ((((this->options).force_zero_initialized_variables == true) &&
                (pSVar13->storage == StorageClassPrivate)) &&
               (((pSVar13->initializer).id == 0 && ((pSVar13->static_expression).id == 0)))) {
              pSVar12 = Compiler::get_variable_data_type(&this->super_Compiler,pSVar13);
              bVar6 = type_can_zero_initialize(this,pSVar12);
              if (bVar6) {
                uVar8 = Compiler::get_variable_data_type_id(&this->super_Compiler,pSVar13);
                ts_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (this->super_Compiler)._vptr_Compiler;
                (**(code **)((long)&ts_1_00[0xd].field_2 + 8))(&local_1268,this,uVar8);
                join<char_const(&)[4],std::__cxx11::string>
                          ((string *)local_1240,(spirv_cross *)0x35bea6,(char (*) [4])&local_1268,
                           ts_1_00);
                ::std::__cxx11::string::operator=((string *)local_1128,(string *)local_1240);
                if ((undefined1 *)local_1240._0_8_ != local_1240 + 0x10) {
                  operator_delete((void *)local_1240._0_8_);
                }
                if ((string *)local_1268._M_p != (string *)local_1258) {
                  operator_delete(local_1268._M_p);
                }
              }
            }
            (*(this->super_Compiler)._vptr_Compiler[0x26])
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1240,this,pSVar13);
            statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                      (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1128,(char (*) [2])0x344553);
            if ((undefined1 *)local_1240._0_8_ != local_1240 + 0x10) {
              operator_delete((void *)local_1240._0_8_);
            }
            local_1299 = '\x01';
            if ((undefined1 *)local_1128._0_8_ != local_1128 + 0x10) {
              operator_delete((void *)local_1128._0_8_);
            }
          }
        }
      }
      lVar22 = lVar22 + 4;
    } while (sVar2 << 2 != lVar22);
  }
  if (local_1299 != '\0') {
    statement<char_const(&)[1]>(this,(char (*) [1])0x33bad0);
  }
  (*(this->super_Compiler)._vptr_Compiler[0x3b])(this);
  return;
}

Assistant:

void CompilerGLSL::emit_resources()
{
	auto &execution = get_entry_point();

	replace_illegal_names();

	// Legacy GL uses gl_FragData[], redeclare all fragment outputs
	// with builtins.
	if (execution.model == ExecutionModelFragment && is_legacy())
		replace_fragment_outputs();

	// Emit PLS blocks if we have such variables.
	if (!pls_inputs.empty() || !pls_outputs.empty())
		emit_pls();

	switch (execution.model)
	{
	case ExecutionModelGeometry:
	case ExecutionModelTessellationControl:
	case ExecutionModelTessellationEvaluation:
	case ExecutionModelMeshEXT:
		fixup_implicit_builtin_block_names(execution.model);
		break;

	default:
		break;
	}

	// Emit custom gl_PerVertex for SSO compatibility.
	if (options.separate_shader_objects && !options.es && execution.model != ExecutionModelFragment)
	{
		switch (execution.model)
		{
		case ExecutionModelGeometry:
		case ExecutionModelTessellationControl:
		case ExecutionModelTessellationEvaluation:
			emit_declared_builtin_block(StorageClassInput, execution.model);
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			break;

		case ExecutionModelVertex:
		case ExecutionModelMeshEXT:
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			break;

		default:
			break;
		}
	}
	else if (should_force_emit_builtin_block(StorageClassOutput))
	{
		emit_declared_builtin_block(StorageClassOutput, execution.model);
	}
	else if (execution.geometry_passthrough)
	{
		// Need to declare gl_in with Passthrough.
		// If we're doing passthrough, we cannot emit an output block, so the output block test above will never pass.
		emit_declared_builtin_block(StorageClassInput, execution.model);
	}
	else
	{
		// Need to redeclare clip/cull distance with explicit size to use them.
		// SPIR-V mandates these builtins have a size declared.
		const char *storage = execution.model == ExecutionModelFragment ? "in" : "out";
		if (clip_distance_count != 0)
			statement(storage, " float gl_ClipDistance[", clip_distance_count, "];");
		if (cull_distance_count != 0)
			statement(storage, " float gl_CullDistance[", cull_distance_count, "];");
		if (clip_distance_count != 0 || cull_distance_count != 0)
			statement("");
	}

	if (position_invariant)
	{
		statement("invariant gl_Position;");
		statement("");
	}

	bool emitted = false;

	// If emitted Vulkan GLSL,
	// emit specialization constants as actual floats,
	// spec op expressions will redirect to the constant name.
	//
	{
		auto loop_lock = ir.create_loop_hard_lock();
		for (auto &id_ : ir.ids_for_constant_or_type)
		{
			auto &id = ir.ids[id_];

			if (id.get_type() == TypeConstant)
			{
				auto &c = id.get<SPIRConstant>();

				bool needs_declaration = c.specialization || c.is_used_as_lut;

				if (needs_declaration)
				{
					if (!options.vulkan_semantics && c.specialization)
					{
						c.specialization_constant_macro_name =
						    constant_value_macro_name(get_decoration(c.self, DecorationSpecId));
					}
					emit_constant(c);
					emitted = true;
				}
			}
			else if (id.get_type() == TypeConstantOp)
			{
				emit_specialization_constant_op(id.get<SPIRConstantOp>());
				emitted = true;
			}
			else if (id.get_type() == TypeType)
			{
				auto *type = &id.get<SPIRType>();

				bool is_natural_struct = type->basetype == SPIRType::Struct && type->array.empty() && !type->pointer &&
				                         (!has_decoration(type->self, DecorationBlock) &&
				                          !has_decoration(type->self, DecorationBufferBlock));

				// Special case, ray payload and hit attribute blocks are not really blocks, just regular structs.
				if (type->basetype == SPIRType::Struct && type->pointer &&
				    has_decoration(type->self, DecorationBlock) &&
				    (type->storage == StorageClassRayPayloadKHR || type->storage == StorageClassIncomingRayPayloadKHR ||
				     type->storage == StorageClassHitAttributeKHR))
				{
					type = &get<SPIRType>(type->parent_type);
					is_natural_struct = true;
				}

				if (is_natural_struct)
				{
					if (emitted)
						statement("");
					emitted = false;

					emit_struct(*type);
				}
			}
		}
	}

	if (emitted)
		statement("");

	// If we needed to declare work group size late, check here.
	// If the work group size depends on a specialization constant, we need to declare the layout() block
	// after constants (and their macros) have been declared.
	if (execution.model == ExecutionModelGLCompute && !options.vulkan_semantics &&
	    (execution.workgroup_size.constant != 0 || execution.flags.get(ExecutionModeLocalSizeId)))
	{
		SpecializationConstant wg_x, wg_y, wg_z;
		get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

		if ((wg_x.id != ConstantID(0)) || (wg_y.id != ConstantID(0)) || (wg_z.id != ConstantID(0)))
		{
			SmallVector<string> inputs;
			build_workgroup_size(inputs, wg_x, wg_y, wg_z);
			statement("layout(", merge(inputs), ") in;");
			statement("");
		}
	}

	emitted = false;

	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
	{
		for (auto type : physical_storage_non_block_pointer_types)
		{
			emit_buffer_reference_block(type, false);
		}

		// Output buffer reference blocks.
		// Do this in two stages, one with forward declaration,
		// and one without. Buffer reference blocks can reference themselves
		// to support things like linked lists.
		ir.for_each_typed_id<SPIRType>([&](uint32_t self, SPIRType &type) {
			if (type.basetype == SPIRType::Struct && type.pointer &&
			    type.pointer_depth == 1 && !type_is_array_of_pointers(type) &&
			    type.storage == StorageClassPhysicalStorageBufferEXT)
			{
				emit_buffer_reference_block(self, true);
			}
		});

		ir.for_each_typed_id<SPIRType>([&](uint32_t self, SPIRType &type) {
			if (type.basetype == SPIRType::Struct &&
			    type.pointer && type.pointer_depth == 1 && !type_is_array_of_pointers(type) &&
			    type.storage == StorageClassPhysicalStorageBufferEXT)
			{
				emit_buffer_reference_block(self, false);
			}
		});
	}

	// Output UBOs and SSBOs
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_block_storage = type.storage == StorageClassStorageBuffer || type.storage == StorageClassUniform ||
		                        type.storage == StorageClassShaderRecordBufferKHR;
		bool has_block_flags = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
		                       ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);

		if (var.storage != StorageClassFunction && type.pointer && is_block_storage && !is_hidden_variable(var) &&
		    has_block_flags)
		{
			emit_buffer_block(var);
		}
	});

	// Output push constant blocks
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		if (var.storage != StorageClassFunction && type.pointer && type.storage == StorageClassPushConstant &&
		    !is_hidden_variable(var))
		{
			emit_push_constant_block(var);
		}
	});

	bool skip_separate_image_sampler = !combined_image_samplers.empty() || !options.vulkan_semantics;

	// Output Uniform Constants (values, samplers, images, etc).
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		// If we're remapping separate samplers and images, only emit the combined samplers.
		if (skip_separate_image_sampler)
		{
			// Sampler buffers are always used without a sampler, and they will also work in regular GL.
			bool sampler_buffer = type.basetype == SPIRType::Image && type.image.dim == DimBuffer;
			bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
			bool separate_sampler = type.basetype == SPIRType::Sampler;
			if (!sampler_buffer && (separate_image || separate_sampler))
				return;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (type.storage == StorageClassUniformConstant || type.storage == StorageClassAtomicCounter ||
		     type.storage == StorageClassRayPayloadKHR || type.storage == StorageClassIncomingRayPayloadKHR ||
		     type.storage == StorageClassCallableDataKHR || type.storage == StorageClassIncomingCallableDataKHR ||
		     type.storage == StorageClassHitAttributeKHR) &&
		    !is_hidden_variable(var))
		{
			emit_uniform(var);
			emitted = true;
		}
	});

	if (emitted)
		statement("");
	emitted = false;

	bool emitted_base_instance = false;

	// Output in/out interfaces.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_hidden = is_hidden_variable(var);

		// Unused output I/O variables might still be required to implement framebuffer fetch.
		if (var.storage == StorageClassOutput && !is_legacy() &&
		    location_is_framebuffer_fetch(get_decoration(var.self, DecorationLocation)) != 0)
		{
			is_hidden = false;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (var.storage == StorageClassInput || var.storage == StorageClassOutput) &&
		    interface_variable_exists_in_entry_point(var.self) && !is_hidden)
		{
			if (options.es && get_execution_model() == ExecutionModelVertex && var.storage == StorageClassInput &&
			    type.array.size() == 1)
			{
				SPIRV_CROSS_THROW("OpenGL ES doesn't support array input variables in vertex shader.");
			}
			emit_interface_block(var);
			emitted = true;
		}
		else if (is_builtin_variable(var))
		{
			auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
			// For gl_InstanceIndex emulation on GLES, the API user needs to
			// supply this uniform.

			// The draw parameter extension is soft-enabled on GL with some fallbacks.
			if (!options.vulkan_semantics)
			{
				if (!emitted_base_instance &&
				    ((options.vertex.support_nonzero_base_instance && builtin == BuiltInInstanceIndex) ||
				     (builtin == BuiltInBaseInstance)))
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseInstance gl_BaseInstanceARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseInstance;");
					statement("#endif");
					emitted = true;
					emitted_base_instance = true;
				}
				else if (builtin == BuiltInBaseVertex)
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseVertex gl_BaseVertexARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseVertex;");
					statement("#endif");
				}
				else if (builtin == BuiltInDrawIndex)
				{
					statement("#ifndef GL_ARB_shader_draw_parameters");
					// Cannot really be worked around.
					statement("#error GL_ARB_shader_draw_parameters is not supported.");
					statement("#endif");
				}
			}
		}
	});

	// Global variables.
	for (auto global : global_variables)
	{
		auto &var = get<SPIRVariable>(global);
		if (is_hidden_variable(var, true))
			continue;

		if (var.storage != StorageClassOutput)
		{
			if (!variable_is_lut(var))
			{
				add_resource_name(var.self);

				string initializer;
				if (options.force_zero_initialized_variables && var.storage == StorageClassPrivate &&
				    !var.initializer && !var.static_expression && type_can_zero_initialize(get_variable_data_type(var)))
				{
					initializer = join(" = ", to_zero_initialized_expression(get_variable_data_type_id(var)));
				}

				statement(variable_decl(var), initializer, ";");
				emitted = true;
			}
		}
		else if (var.initializer && maybe_get<SPIRConstant>(var.initializer) != nullptr)
		{
			emit_output_variable_initializer(var);
		}
	}

	if (emitted)
		statement("");

	declare_undefined_values();
}